

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

complex<long_double> * __thiscall
TPZMatrix<std::complex<long_double>_>::ConditionNumber
          (TPZMatrix<std::complex<long_double>_> *this,int p,int64_t numiter,REAL tol)

{
  int iVar1;
  ostream *poVar2;
  TPZFMatrix<std::complex<long_double>_> *in_RSI;
  TPZFMatrix<std::complex<long_double>_> *in_RDI;
  complex<long_double> invnorm;
  complex<long_double> thisnorm;
  TPZFMatrix<std::complex<long_double>_> Inv;
  REAL localtol;
  int64_t localnumiter;
  REAL in_stack_000001c8;
  int64_t in_stack_000001d0;
  int in_stack_000001dc;
  TPZMatrix<std::complex<long_double>_> *in_stack_000001e0;
  complex<long_double> *in_stack_fffffffffffffe98;
  undefined2 in_stack_fffffffffffffea0;
  undefined6 in_stack_fffffffffffffea2;
  TPZFMatrix<std::complex<long_double>_> *pTVar3;
  TPZMatrix<std::complex<long_double>_> *in_stack_fffffffffffffee8;
  
  pTVar3 = in_RDI;
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix(in_RDI);
  MatrixNorm(in_stack_000001e0,in_stack_000001dc,in_stack_000001d0,in_stack_000001c8);
  iVar1 = Inverse(in_stack_fffffffffffffee8,in_RSI,(DecomposeType)((ulong)pTVar3 >> 0x20));
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "TVar TPZMatrix<std::complex<long double>>::ConditionNumber(int, int64_t, REAL) [T = std::complex<long double>]"
                            );
    poVar2 = std::operator<<(poVar2," - it was not possible to compute the inverse matrix.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::complex<long_double>::complex((complex<long_double> *)in_RDI,(longdouble)0,(longdouble)0);
  }
  else {
    MatrixNorm(in_stack_000001e0,in_stack_000001dc,in_stack_000001d0,in_stack_000001c8);
    std::operator*((complex<long_double> *)
                   CONCAT62(in_stack_fffffffffffffea2,in_stack_fffffffffffffea0),
                   in_stack_fffffffffffffe98);
  }
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix
            ((TPZFMatrix<std::complex<long_double>_> *)0x12be59e);
  return (complex<long_double> *)pTVar3;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}